

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_subi_16_pi(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar5 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar5);
  }
  uVar1 = m68k_read_memory_16(uVar5 & m68ki_cpu.address_mask);
  uVar5 = m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8];
  m68ki_cpu.dar[(ulong)(m68ki_cpu.ir & 7) + 8] = uVar5 + 2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar2 = uVar5;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar2 = pmmu_translate_addr(uVar5);
  }
  uVar3 = m68k_read_memory_16(uVar2 & m68ki_cpu.address_mask);
  uVar4 = uVar3 - uVar1;
  m68ki_cpu.x_flag = uVar4 >> 8;
  m68ki_cpu.v_flag = ((uVar4 ^ uVar3) & (uVar1 ^ uVar3)) >> 8;
  m68ki_cpu.n_flag = m68ki_cpu.x_flag;
  m68ki_cpu.not_z_flag = uVar4 & 0xffff;
  m68ki_cpu.c_flag = m68ki_cpu.x_flag;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar5 = pmmu_translate_addr(uVar5);
  }
  m68k_write_memory_16(uVar5 & m68ki_cpu.address_mask,uVar4 & 0xffff);
  return;
}

Assistant:

static void m68k_op_subi_16_pi(void)
{
	uint src = OPER_I_16();
	uint ea = EA_AY_PI_16();
	uint dst = m68ki_read_16(ea);
	uint res = dst - src;

	FLAG_N = NFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);
	FLAG_X = FLAG_C = CFLAG_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);

	m68ki_write_16(ea, FLAG_Z);
}